

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_resampler_uninit(ma_resampler *pResampler,ma_allocation_callbacks *pAllocationCallbacks)

{
  void *in_RSI;
  undefined8 *in_RDI;
  ma_allocation_callbacks *in_stack_ffffffffffffffe8;
  
  if ((((in_RDI != (undefined8 *)0x0) && (in_RDI[1] != 0)) && (*(long *)(in_RDI[1] + 0x10) != 0)) &&
     ((**(code **)(in_RDI[1] + 0x10))(in_RDI[2],*in_RDI,in_RSI), *(int *)(in_RDI + 0x17) != 0)) {
    ma_free(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

MA_API void ma_resampler_uninit(ma_resampler* pResampler, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pResampler == NULL) {
        return;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onUninit == NULL) {
        return;
    }

    pResampler->pBackendVTable->onUninit(pResampler->pBackendUserData, pResampler->pBackend, pAllocationCallbacks);

    if (pResampler->_ownsHeap) {
        ma_free(pResampler->_pHeap, pAllocationCallbacks);
    }
}